

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tonk.cpp
# Opt level: O1

TonkResult tonk_inject(TonkSocket tonkSocket,uint16_t sourcePort,void *data,uint32_t bytes)

{
  TonkResult TVar1;
  undefined6 in_register_00000032;
  Result result;
  Result local_10;
  
  TVar1 = Tonk_InvalidInput;
  if ((bytes != 0 && data != (void *)0x0) &&
      ((int)CONCAT62(in_register_00000032,sourcePort) != 0 && tonkSocket != (TonkSocket)0x0)) {
    tonk::ApplicationSession::tonk_inject
              ((ApplicationSession *)&stack0xfffffffffffffff0,(uint16_t)tonkSocket,
               (uint8_t *)(ulong)sourcePort,(uint32_t)data);
    if (local_10.Error == (ErrorResult *)0x0) {
      TVar1 = Tonk_Success;
    }
    else {
      switch((local_10.Error)->Type) {
      case Tonk:
        TVar1 = (TonkResult)(local_10.Error)->Code;
        break;
      case Siamese:
        TVar1 = Tonk_FECFailed;
        break;
      case Asio:
      case LastErr:
        TVar1 = Tonk_NetworkFailed;
        break;
      case Cymric:
        TVar1 = Tonk_PRNGFailed;
        break;
      default:
        TVar1 = Tonk_Error;
      }
    }
    tonk::Result::~Result(&stack0xfffffffffffffff0);
  }
  return TVar1;
}

Assistant:

TONK_EXPORT TonkResult tonk_inject(
    TonkSocket   tonkSocket, ///< [in] Socket to inject
    uint16_t     sourcePort, ///< [in] Source port of datagram
    const void*        data, ///< [in] Datagram data
    uint32_t          bytes  ///< [in] Datagram bytes
)
{
    auto session = reinterpret_cast<ApplicationSession*>(tonkSocket);
    if (!session || sourcePort == 0 || !data || bytes <= 0)
    {
        TONK_DEBUG_BREAK(); // Invalid input
        return Tonk_InvalidInput;
    }

    Result result = session->tonk_inject(
        sourcePort,
        reinterpret_cast<const uint8_t*>(data),
        bytes);
    return TonkResultFromDetailedResult(result);
}